

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  Type result_type;
  int line_number;
  AssertHelperData *pAVar1;
  char *file_name;
  UnitTest *this_00;
  UnitTest *this_01;
  UnitTestImpl *this_02;
  TestPartResultReporterInterface local_18;
  Message *message_local;
  AssertHelper *this_local;
  
  local_18._vptr_TestPartResultReporterInterface = (_func_int **)message;
  message_local = (Message *)this;
  this_00 = UnitTest::GetInstance();
  pAVar1 = this->data_;
  result_type = pAVar1->type;
  file_name = pAVar1->file;
  line_number = pAVar1->line;
  AppendUserMessage((internal *)&stack0xffffffffffffffd8,&pAVar1->message,
                    (Message *)local_18._vptr_TestPartResultReporterInterface);
  this_01 = UnitTest::GetInstance();
  this_02 = UnitTest::impl(this_01);
  UnitTestImpl::CurrentOsStackTraceExceptTop((UnitTestImpl *)&stack0xffffffffffffffc8,(int)this_02);
  UnitTest::AddTestPartResult
            (this_00,result_type,file_name,line_number,(String *)&stack0xffffffffffffffd8,
             (String *)&stack0xffffffffffffffc8);
  String::~String((String *)this_02);
  String::~String((String *)this_02);
  return;
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->
    AddTestPartResult(data_->type, data_->file, data_->line,
                      AppendUserMessage(data_->message, message),
                      UnitTest::GetInstance()->impl()
                      ->CurrentOsStackTraceExceptTop(1)
                      // Skips the stack frame for this function itself.
                      );  // NOLINT
}